

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_TestShell::createTest
          (TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_TestShell *this)

{
  TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_Test *this_00;
  
  this_00 = (TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                         ,0xaa);
  TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_Test::
  TEST_ScoringTableTest_NonDealerWinByDiscard_ManganOrMore_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(ScoringTableTest, NonDealerWinByDiscard_ManganOrMore)
{
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(3, 70));
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(4, 40));
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(4, 70));
	CHECK_EQUAL(8000, t.nonDealerWinByDiscard(5, 0));

	CHECK_EQUAL(12000, t.nonDealerWinByDiscard(6, 0));
	CHECK_EQUAL(12000, t.nonDealerWinByDiscard(7, 0));

	CHECK_EQUAL(16000, t.nonDealerWinByDiscard(8, 0));
	CHECK_EQUAL(16000, t.nonDealerWinByDiscard(9, 0));
	CHECK_EQUAL(16000, t.nonDealerWinByDiscard(10, 0));

	CHECK_EQUAL(24000, t.nonDealerWinByDiscard(11, 0));
	CHECK_EQUAL(24000, t.nonDealerWinByDiscard(12, 0));

	CHECK_EQUAL(32000, t.nonDealerWinByDiscard(13, 0));
}